

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

int __thiscall Vector::remove(Vector *this,char *__filename)

{
  int iVar1;
  long *in_RAX;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = (int)in_RAX;
  if (__filename < (char *)this->vLength) {
    pcVar3 = __filename + 1;
    pcVar2 = (char *)this->vLength;
    if (pcVar3 < pcVar2) {
      in_RAX = this->vData;
      do {
        in_RAX[(long)(pcVar3 + -1)] = in_RAX[(long)pcVar3];
        pcVar3 = pcVar3 + 1;
        pcVar2 = (char *)this->vLength;
      } while (pcVar3 < pcVar2);
    }
    iVar1 = (int)in_RAX;
    this->vLength = (unsigned_long)(pcVar2 + -1);
  }
  return iVar1;
}

Assistant:

void Vector::remove(const unsigned long l) {
  if (l < vLength) {
    for (unsigned long k = l + 1; k < vLength; k++) {
      vData[k - 1] = vData[k];
    }
    vLength--;
  }
}